

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_bool_t ktxTexture2_NeedsTranscoding(ktxTexture2 *This)

{
  ktxTexture2 *This_local;
  ktx_bool_t local_1;
  
  if ((This->pDfd[3] & 0xff) == 0xa3) {
    local_1 = true;
  }
  else if ((This->pDfd[3] & 0xff) == 0xa6) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

ktx_bool_t
ktxTexture2_NeedsTranscoding(ktxTexture2* This)
{
    if (KHR_DFDVAL(This->pDfd + 1, MODEL) == KHR_DF_MODEL_ETC1S)
        return true;
    else if (KHR_DFDVAL(This->pDfd + 1, MODEL) == KHR_DF_MODEL_UASTC)
        return true;
    else
        return false;
}